

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topo_data.hpp
# Opt level: O0

void __thiscall topo_data::topo_data(topo_data *this,MPI_Comm mpi_comm)

{
  int iVar1;
  char *__nptr;
  undefined8 in_RSI;
  int *in_RDI;
  char *ppn_char;
  int num_procs;
  int rank;
  int local_18;
  int local_14;
  undefined8 local_10;
  
  local_10 = in_RSI;
  MPI_Comm_rank(in_RSI,&local_14);
  MPI_Comm_size(local_10,&local_18);
  __nptr = getenv("PPN");
  in_RDI[1] = 0x10;
  if (__nptr != (char *)0x0) {
    iVar1 = atoi(__nptr);
    in_RDI[1] = iVar1;
  }
  in_RDI[2] = (local_18 + -1) / in_RDI[1] + 1;
  iVar1 = get_ordering();
  *in_RDI = iVar1;
  iVar1 = get_node(local_14,*in_RDI,in_RDI[2],in_RDI[1]);
  in_RDI[3] = iVar1;
  MPI_Comm_split(local_10,in_RDI[3],local_14,in_RDI + 4);
  return;
}

Assistant:

topo_data(MPI_Comm mpi_comm)
    {
        int rank, num_procs;
        MPI_Comm_rank(mpi_comm, &rank);
        MPI_Comm_size(mpi_comm, &num_procs);

#ifdef USING_MPI3
        MPI_Comm_split_type(mpi_comm, MPI_COMM_TYPE_SHARED, rank, MPI_INFO_NULL, &local_comm);

        // Determine processes per node
        MPI_Comm_size(local_comm, &ppn);

        // Determine number of nodes
        // Assuming num_nodes divides num_procs evenly
        num_nodes = ((num_procs-1) / ppn) + 1;
#else
        char* ppn_char = getenv("PPN");
        ppn = 16;
        if (ppn_char)
        {
            ppn = atoi(ppn_char);
        }
        num_nodes = ((num_procs-1) / ppn) + 1;
#endif
        rank_ordering = get_ordering();  // If not Cray or BGQ, assuming SMP style order
        rank_node = get_node(rank, rank_ordering, num_nodes, ppn);

#ifndef USING_MPI3
        MPI_Comm_split(mpi_comm, rank_node, rank, &local_comm);
#endif
    }